

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::noteLabelName(FunctionValidator *this,Name name)

{
  Name curr;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar1;
  __node_gen_type __node_gen;
  Name name_local;
  
  __node_gen._M_h = name.super_IString.str._M_len;
  if (name.super_IString.str._M_str != (char *)0x0) {
    pVar1 = std::
            _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                      ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)&this->labelNames,&__node_gen);
    curr.super_IString.str._M_str = name.super_IString.str._M_str;
    curr.super_IString.str._M_len = (size_t)__node_gen._M_h;
    ValidationInfo::shouldBeTrue<wasm::Name>
              (this->info,(bool)(pVar1.second & 1),curr,
               "names in Binaryen IR must be unique - IR generators must ensure that",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
  }
  return;
}

Assistant:

void FunctionValidator::noteLabelName(Name name) {
  if (!name.is()) {
    return;
  }
  auto [_, inserted] = labelNames.insert(name);
  shouldBeTrue(
    inserted,
    name,
    "names in Binaryen IR must be unique - IR generators must ensure that");
}